

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::CreateThread<vkt::api::(anonymous_namespace)::BufferView>::runThread
          (CreateThread<vkt::api::(anonymous_namespace)::BufferView> *this)

{
  byte bVar1;
  int iVar2;
  RefBase<vk::Handle<(vk::HandleType)12>_> local_78;
  RefBase<vk::Handle<(vk::HandleType)12>_> local_58;
  
  bVar1 = 0;
  for (iVar2 = 0; iVar2 != -100; iVar2 = iVar2 + -1) {
    if ((byte)((bVar1 / 0x14) * -0x14) == (char)iVar2) {
      ThreadGroupThread::barrier(&this->super_ThreadGroupThread);
    }
    BufferView::create((Move<vk::Handle<(vk::HandleType)12>_> *)&local_78,this->m_env,
                       this->m_resources,this->m_params);
    local_58.m_data.deleter.m_device = local_78.m_data.deleter.m_device;
    local_58.m_data.deleter.m_allocator = local_78.m_data.deleter.m_allocator;
    local_58.m_data.object.m_internal = local_78.m_data.object.m_internal;
    local_58.m_data.deleter.m_deviceIface = local_78.m_data.deleter.m_deviceIface;
    local_78.m_data.object.m_internal = 0;
    local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_78.m_data.deleter.m_device = (VkDevice)0x0;
    local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase(&local_78);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase(&local_58);
    bVar1 = bVar1 + 1;
  }
  return;
}

Assistant:

void runThread (void)
	{
		const int	numIters			= getCreateCount<Object>();
		const int	itersBetweenSyncs	= numIters / 5;

		DE_ASSERT(itersBetweenSyncs > 0);

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Sync every Nth iteration to make entering driver at the same time more likely
			if ((iterNdx % itersBetweenSyncs) == 0)
				barrier();

			{
				Unique<typename Object::Type>	obj	(Object::create(m_env, m_resources, m_params));
			}
		}
	}